

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

bool __thiscall
matchit::impl::Id<mathiu::impl::Intersection>::matchValue<mathiu::impl::Intersection_const&>
          (Id<mathiu::impl::Intersection> *this,Intersection *v)

{
  bool bVar1;
  Intersection *lhs;
  IdBlockBase<mathiu::impl::Intersection> *this_00;
  ValueVariant<mathiu::impl::Intersection> *pVVar2;
  Intersection *v_local;
  Id<mathiu::impl::Intersection> *this_local;
  
  bVar1 = hasValue(this);
  if (bVar1) {
    lhs = internalValue(this);
    this_local._7_1_ = IdTraits<mathiu::impl::Intersection>::equal(lhs,v);
  }
  else {
    this_00 = &block(this)->super_IdBlockBase<mathiu::impl::Intersection>;
    pVVar2 = IdBlockBase<mathiu::impl::Intersection>::variant(this_00);
    IdUtil<mathiu::impl::Intersection>::bindValue<mathiu::impl::Intersection_const&>(pVVar2,v);
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

constexpr auto
                matchValue(Value &&v) const
            {
                if (hasValue())
                {
                    return IdTraits<std::decay_t<Type>>::equal(internalValue(), v);
                }
                IdUtil<Type>::bindValue(block().variant(), std::forward<Value>(v),
                                   StorePointer<Type, Value>{});
                return true;
            }